

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_eliminate_unused_offset
          (REF_INT nglobal,REF_GLOB *sorted_globals,REF_INT nunused,REF_GLOB *sorted_unused)

{
  bool bVar1;
  int local_30;
  int local_2c;
  REF_INT i;
  REF_INT offset;
  REF_GLOB *sorted_unused_local;
  REF_INT nunused_local;
  REF_GLOB *sorted_globals_local;
  REF_INT nglobal_local;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < nglobal; local_30 = local_30 + 1) {
    while( true ) {
      bVar1 = false;
      if (local_2c < nunused) {
        bVar1 = sorted_unused[local_2c] < sorted_globals[local_30];
      }
      if (!bVar1) break;
      local_2c = local_2c + 1;
    }
    sorted_globals[local_30] = sorted_globals[local_30] - (long)local_2c;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_offset(REF_INT nglobal,
                                                    REF_GLOB *sorted_globals,
                                                    REF_INT nunused,
                                                    REF_GLOB *sorted_unused) {
  REF_INT offset;
  REF_INT i;
  offset = 0;
  for (i = 0; i < nglobal; i++) {
    while ((offset < nunused) && (sorted_unused[offset] < sorted_globals[i])) {
      offset++;
    }
    /* assert there are no unused in global list */
    sorted_globals[i] -= (REF_GLOB)offset;
  }

  return REF_SUCCESS;
}